

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O3

JoinRelationSet * __thiscall
duckdb::CardinalityEstimator::UpdateNumeratorRelations
          (CardinalityEstimator *this,Subgraph2Denominator left,Subgraph2Denominator right,
          FilterInfoWithTotalDomains *filter)

{
  FilterInfo *pFVar1;
  optional_ptr<duckdb::JoinRelationSet,_true> oVar2;
  bool bVar3;
  
  optional_ptr<duckdb::FilterInfo,_true>::CheckValid(&filter->filter_info);
  if ((byte)(((filter->filter_info).ptr)->join_type - SEMI) < 2) {
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&left.relations);
    oVar2 = left.relations;
    optional_ptr<duckdb::FilterInfo,_true>::CheckValid(&filter->filter_info);
    pFVar1 = (filter->filter_info).ptr;
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pFVar1->left_set);
    bVar3 = JoinRelationSet::IsSubset(oVar2.ptr,(pFVar1->left_set).ptr);
    if (bVar3) {
      optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&right.relations);
      oVar2 = right.relations;
      optional_ptr<duckdb::FilterInfo,_true>::CheckValid(&filter->filter_info);
      pFVar1 = (filter->filter_info).ptr;
      optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pFVar1->right_set);
      bVar3 = JoinRelationSet::IsSubset(oVar2.ptr,(pFVar1->right_set).ptr);
      if (bVar3) {
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&left.numerator_relations);
        return left.numerator_relations.ptr;
      }
    }
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&right.numerator_relations);
  }
  else {
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&left.numerator_relations);
    oVar2 = left.numerator_relations;
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&right.numerator_relations);
    right.numerator_relations.ptr =
         JoinRelationSetManager::Union(&this->set_manager,oVar2.ptr,right.numerator_relations.ptr);
  }
  return right.numerator_relations.ptr;
}

Assistant:

JoinRelationSet &CardinalityEstimator::UpdateNumeratorRelations(Subgraph2Denominator left, Subgraph2Denominator right,
                                                                FilterInfoWithTotalDomains &filter) {
	switch (filter.filter_info->join_type) {
	case JoinType::SEMI:
	case JoinType::ANTI: {
		if (JoinRelationSet::IsSubset(*left.relations, *filter.filter_info->left_set) &&
		    JoinRelationSet::IsSubset(*right.relations, *filter.filter_info->right_set)) {
			return *left.numerator_relations;
		}
		return *right.numerator_relations;
	}
	default:
		// cross product or inner join
		return set_manager.Union(*left.numerator_relations, *right.numerator_relations);
	}
}